

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsimd_avx.hpp
# Opt level: O1

batch * __thiscall
ear::PolarExtentCoreSimd<xsimd::avx>::weight_from_sin
          (batch *__return_storage_ptr__,PolarExtentCoreSimd<xsimd::avx> *this,
          PolarExtentCoreContext *ctx,batch sin_angle)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [32];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  batch *in_RAX;
  undefined1 auVar12 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  
  uVar1 = *(undefined4 *)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore;
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  auVar12 = in_ZMM0._0_32_;
  auVar13 = vcmpps_avx(auVar12,auVar13,2);
  auVar16 = vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
  auVar20 = auVar16 & ~auVar13;
  if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0x7f,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar20 >> 0xbf,0) != '\0') ||
      (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0') {
    uVar1 = *(undefined4 *)((long)&this[0x10].super_PolarExtentCore._vptr_PolarExtentCore + 4);
    auVar15._4_4_ = uVar1;
    auVar15._0_4_ = uVar1;
    auVar15._8_4_ = uVar1;
    auVar15._12_4_ = uVar1;
    auVar15._16_4_ = uVar1;
    auVar15._20_4_ = uVar1;
    auVar15._24_4_ = uVar1;
    auVar15._28_4_ = uVar1;
    auVar20 = vcmpps_avx(auVar15,auVar12,2);
    auVar16 = auVar16 & ~auVar20;
    if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar16 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar16 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar16 >> 0x7f,0) != '\0') ||
          (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar16 >> 0xbf,0) != '\0') ||
        (auVar16 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar16[0x1f] < '\0')
    {
      fVar2 = *(float *)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore;
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar16._16_4_ = 0x7fffffff;
      auVar16._20_4_ = 0x7fffffff;
      auVar16._24_4_ = 0x7fffffff;
      auVar16._28_4_ = 0x7fffffff;
      auVar16 = vandps_avx(auVar12,auVar16);
      auVar19._8_4_ = 0x80000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar19._12_4_ = 0x80000000;
      auVar19._16_4_ = 0x80000000;
      auVar19._20_4_ = 0x80000000;
      auVar19._24_4_ = 0x80000000;
      auVar19._28_4_ = 0x80000000;
      auVar20._8_4_ = 0x3f000000;
      auVar20._0_8_ = 0x3f0000003f000000;
      auVar20._12_4_ = 0x3f000000;
      auVar20._16_4_ = 0x3f000000;
      auVar20._20_4_ = 0x3f000000;
      auVar20._24_4_ = 0x3f000000;
      auVar20._28_4_ = 0x3f000000;
      auVar14 = vcmpps_avx(auVar20,auVar16,1);
      auVar17._8_4_ = 0x3f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._12_4_ = 0x3f800000;
      auVar17._16_4_ = 0x3f800000;
      auVar17._20_4_ = 0x3f800000;
      auVar17._24_4_ = 0x3f800000;
      auVar17._28_4_ = 0x3f800000;
      auVar20 = vsubps_avx(auVar17,auVar16);
      auVar3._4_4_ = auVar20._4_4_ * 0.5;
      auVar3._0_4_ = auVar20._0_4_ * 0.5;
      auVar3._8_4_ = auVar20._8_4_ * 0.5;
      auVar3._12_4_ = auVar20._12_4_ * 0.5;
      auVar3._16_4_ = auVar20._16_4_ * 0.5;
      auVar3._20_4_ = auVar20._20_4_ * 0.5;
      auVar3._24_4_ = auVar20._24_4_ * 0.5;
      auVar3._28_4_ = 0x3f000000;
      auVar11._4_4_ = in_ZMM0._4_4_ * in_ZMM0._4_4_;
      auVar11._0_4_ = in_ZMM0._0_4_ * in_ZMM0._0_4_;
      auVar11._8_4_ = in_ZMM0._8_4_ * in_ZMM0._8_4_;
      auVar11._12_4_ = in_ZMM0._12_4_ * in_ZMM0._12_4_;
      auVar11._16_4_ = in_ZMM0._16_4_ * in_ZMM0._16_4_;
      auVar11._20_4_ = in_ZMM0._20_4_ * in_ZMM0._20_4_;
      auVar11._24_4_ = in_ZMM0._24_4_ * in_ZMM0._24_4_;
      auVar11._28_4_ = auVar20._28_4_;
      auVar3 = vblendvps_avx(auVar11,auVar3,auVar14);
      auVar11 = vsqrtps_avx(auVar3);
      auVar20 = vandps_avx(auVar12,auVar19);
      auVar16 = vblendvps_avx(auVar16,auVar11,auVar14);
      fVar4 = auVar3._0_4_;
      fVar5 = auVar3._4_4_;
      fVar6 = auVar3._8_4_;
      fVar7 = auVar3._12_4_;
      fVar8 = auVar3._16_4_;
      fVar9 = auVar3._20_4_;
      fVar10 = auVar3._24_4_;
      auVar18._0_4_ =
           auVar16._0_4_ +
           ((((fVar4 * 0.0421632 + 0.024181312) * fVar4 + 0.045470025) * fVar4 + 0.074953005) *
            fVar4 + 0.16666752) * fVar4 * auVar16._0_4_;
      auVar18._4_4_ =
           auVar16._4_4_ +
           ((((fVar5 * 0.0421632 + 0.024181312) * fVar5 + 0.045470025) * fVar5 + 0.074953005) *
            fVar5 + 0.16666752) * fVar5 * auVar16._4_4_;
      auVar18._8_4_ =
           auVar16._8_4_ +
           ((((fVar6 * 0.0421632 + 0.024181312) * fVar6 + 0.045470025) * fVar6 + 0.074953005) *
            fVar6 + 0.16666752) * fVar6 * auVar16._8_4_;
      auVar18._12_4_ =
           auVar16._12_4_ +
           ((((fVar7 * 0.0421632 + 0.024181312) * fVar7 + 0.045470025) * fVar7 + 0.074953005) *
            fVar7 + 0.16666752) * fVar7 * auVar16._12_4_;
      auVar18._16_4_ =
           auVar16._16_4_ +
           ((((fVar8 * 0.0421632 + 0.024181312) * fVar8 + 0.045470025) * fVar8 + 0.074953005) *
            fVar8 + 0.16666752) * fVar8 * auVar16._16_4_;
      auVar18._20_4_ =
           auVar16._20_4_ +
           ((((fVar9 * 0.0421632 + 0.024181312) * fVar9 + 0.045470025) * fVar9 + 0.074953005) *
            fVar9 + 0.16666752) * fVar9 * auVar16._20_4_;
      auVar18._24_4_ =
           auVar16._24_4_ +
           ((((fVar10 * 0.0421632 + 0.024181312) * fVar10 + 0.045470025) * fVar10 + 0.074953005) *
            fVar10 + 0.16666752) * fVar10 * auVar16._24_4_;
      auVar18._28_4_ = auVar16._28_4_ + auVar3._28_4_;
      auVar21._0_4_ = auVar18._0_4_ + auVar18._0_4_;
      auVar21._4_4_ = auVar18._4_4_ + auVar18._4_4_;
      auVar21._8_4_ = auVar18._8_4_ + auVar18._8_4_;
      auVar21._12_4_ = auVar18._12_4_ + auVar18._12_4_;
      auVar21._16_4_ = auVar18._16_4_ + auVar18._16_4_;
      auVar21._20_4_ = auVar18._20_4_ + auVar18._20_4_;
      auVar21._24_4_ = auVar18._24_4_ + auVar18._24_4_;
      auVar21._28_4_ = auVar18._28_4_ + auVar18._28_4_;
      auVar22._8_4_ = 0x3fc90fdb;
      auVar22._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar22._12_4_ = 0x3fc90fdb;
      auVar22._16_4_ = 0x3fc90fdb;
      auVar22._20_4_ = 0x3fc90fdb;
      auVar22._24_4_ = 0x3fc90fdb;
      auVar22._28_4_ = 0x3fc90fdb;
      auVar16 = vsubps_avx(auVar22,auVar21);
      auVar16 = vblendvps_avx(auVar18,auVar16,auVar14);
      fVar4 = *(float *)((long)&this[0x11].super_PolarExtentCore._vptr_PolarExtentCore + 4);
      auVar14._0_4_ = fVar2 * (float)(auVar20._0_4_ ^ auVar16._0_4_) + fVar4;
      auVar14._4_4_ = fVar2 * (float)(auVar20._4_4_ ^ auVar16._4_4_) + fVar4;
      auVar14._8_4_ = fVar2 * (float)(auVar20._8_4_ ^ auVar16._8_4_) + fVar4;
      auVar14._12_4_ = fVar2 * (float)(auVar20._12_4_ ^ auVar16._12_4_) + fVar4;
      auVar14._16_4_ = fVar2 * (float)(auVar20._16_4_ ^ auVar16._16_4_) + fVar4;
      auVar14._20_4_ = fVar2 * (float)(auVar20._20_4_ ^ auVar16._20_4_) + fVar4;
      auVar14._24_4_ = fVar2 * (float)(auVar20._24_4_ ^ auVar16._24_4_) + fVar4;
      auVar14._28_4_ = fVar2 + fVar4;
      auVar16 = vcmpps_avx(auVar15,auVar12,6);
      auVar16 = vandps_avx(auVar16,auVar14);
      vblendvps_avx(auVar16,auVar17,auVar13);
    }
  }
  return in_RAX;
}

Assistant:

inline batch<float, A> broadcast(float val, requires_arch<avx>) noexcept
        {
            return _mm256_set1_ps(val);
        }